

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O3

int __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::Skip
          (CopyingFileInputStream *this,int count)

{
  int iVar1;
  int extraout_EAX;
  __off_t _Var2;
  int block_size;
  CopyingOutputStreamAdaptor *this_00;
  
  if (this->is_closed_ == true) {
    this_00 = (CopyingOutputStreamAdaptor *)&stack0xffffffffffffffe0;
    Skip((CopyingFileInputStream *)this_00);
    (this_00->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
         (_func_int **)&PTR__FileOutputStream_004bbdb8;
    CopyingOutputStreamAdaptor::CopyingOutputStreamAdaptor
              (this_00,(CopyingOutputStream *)(this_00 + 1),block_size);
    (this_00->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
         (_func_int **)&PTR__FileOutputStream_004bbdb8;
    FileOutputStream::CopyingFileOutputStream::CopyingFileOutputStream
              ((CopyingFileOutputStream *)(this_00 + 1),count);
    return extraout_EAX;
  }
  if (this->previous_seek_failed_ == false) {
    _Var2 = lseek(this->file_,(long)count,1);
    if (_Var2 != -1) {
      return count;
    }
  }
  this->previous_seek_failed_ = true;
  iVar1 = CopyingInputStream::Skip(&this->super_CopyingInputStream,count);
  return iVar1;
}

Assistant:

int FileInputStream::CopyingFileInputStream::Skip(int count) {
  ABSL_CHECK(!is_closed_);

  if (!previous_seek_failed_ && lseek(file_, count, SEEK_CUR) != (off_t)-1) {
    // Seek succeeded.
    return count;
  } else {
    // Failed to seek.

    // Note to self:  Don't seek again.  This file descriptor doesn't
    // support it.
    previous_seek_failed_ = true;

    // Use the default implementation.
    return CopyingInputStream::Skip(count);
  }
}